

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void hw_watchpoint_update_aarch64(ARMCPU_conflict1 *cpu,int n)

{
  CPUWatchpoint **watchpoint;
  CPUWatchpoint *value;
  CPUWatchpoint *value_00;
  uint uVar1;
  int flags;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  vaddr len;
  vaddr addr;
  
  watchpoint = (cpu->env).cpu_watchpoint + n;
  value = watchpoint[-0x54a];
  value_00 = watchpoint[-0x53a];
  if (*watchpoint != (CPUWatchpoint *)0x0) {
    cpu_watchpoint_remove_by_ref_aarch64(&cpu->parent_obj,*watchpoint);
    *watchpoint = (CPUWatchpoint *)0x0;
  }
  uVar3 = extract64((uint64_t)value_00,0,1);
  if (uVar3 != 0) {
    uVar3 = extract64((uint64_t)value_00,3,2);
    switch(uVar3) {
    case 0:
      goto switchD_005a49ca_caseD_0;
    case 1:
      flags = 0x25;
      break;
    case 2:
      flags = 0x26;
      break;
    case 3:
      flags = 0x27;
      break;
    default:
      flags = 0x24;
    }
    uVar3 = extract64((uint64_t)value_00,0x18,4);
    if (1 < (int)uVar3 - 1U) {
      if ((int)uVar3 == 0) {
        uVar3 = extract64((uint64_t)value_00,5,8);
        uVar4 = extract64((uint64_t)value,2,1);
        uVar5 = (uint)uVar3 & 0xf;
        if (uVar4 == 0) {
          uVar5 = (uint)uVar3;
        }
        if (uVar5 == 0) {
          return;
        }
        uVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar5 = (int)uVar5 >> ((byte)uVar1 & 0x1f) ^ 0xffffffff;
        if (uVar5 == 0) {
          uVar2 = 0x20;
        }
        else {
          uVar2 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
        }
        len = (vaddr)uVar2;
        addr = (long)&value->vaddr + (ulong)uVar1;
      }
      else {
        len = 1L << ((byte)uVar3 & 0x3f);
        addr = (ulong)value & -len;
      }
      cpu_watchpoint_insert_aarch64(&cpu->parent_obj,addr,len,flags,watchpoint);
      return;
    }
  }
switchD_005a49ca_caseD_0:
  return;
}

Assistant:

void hw_watchpoint_update(ARMCPU *cpu, int n)
{
    CPUARMState *env = &cpu->env;
    vaddr len = 0;
    vaddr wvr = env->cp15.dbgwvr[n];
    uint64_t wcr = env->cp15.dbgwcr[n];
    int mask;
    int flags = BP_CPU | BP_STOP_BEFORE_ACCESS;

    if (env->cpu_watchpoint[n]) {
        cpu_watchpoint_remove_by_ref(CPU(cpu), env->cpu_watchpoint[n]);
        env->cpu_watchpoint[n] = NULL;
    }

    if (!extract64(wcr, 0, 1)) {
        /* E bit clear : watchpoint disabled */
        return;
    }

    switch (extract64(wcr, 3, 2)) {
    case 0:
        /* LSC 00 is reserved and must behave as if the wp is disabled */
        return;
    case 1:
        flags |= BP_MEM_READ;
        break;
    case 2:
        flags |= BP_MEM_WRITE;
        break;
    case 3:
        flags |= BP_MEM_ACCESS;
        break;
    }

    /* Attempts to use both MASK and BAS fields simultaneously are
     * CONSTRAINED UNPREDICTABLE; we opt to ignore BAS in this case,
     * thus generating a watchpoint for every byte in the masked region.
     */
    mask = extract64(wcr, 24, 4);
    if (mask == 1 || mask == 2) {
        /* Reserved values of MASK; we must act as if the mask value was
         * some non-reserved value, or as if the watchpoint were disabled.
         * We choose the latter.
         */
        return;
    } else if (mask) {
        /* Watchpoint covers an aligned area up to 2GB in size */
        len = 1ULL << mask;
        /* If masked bits in WVR are not zero it's CONSTRAINED UNPREDICTABLE
         * whether the watchpoint fires when the unmasked bits match; we opt
         * to generate the exceptions.
         */
        wvr &= ~(len - 1);
    } else {
        /* Watchpoint covers bytes defined by the byte address select bits */
        int bas = extract64(wcr, 5, 8);
        int basstart;

        if (extract64(wvr, 2, 1)) {
            /* Deprecated case of an only 4-aligned address. BAS[7:4] are
             * ignored, and BAS[3:0] define which bytes to watch.
             */
            bas &= 0xf;
        }

        if (bas == 0) {
            /* This must act as if the watchpoint is disabled */
            return;
        }

        /* The BAS bits are supposed to be programmed to indicate a contiguous
         * range of bytes. Otherwise it is CONSTRAINED UNPREDICTABLE whether
         * we fire for each byte in the word/doubleword addressed by the WVR.
         * We choose to ignore any non-zero bits after the first range of 1s.
         */
        basstart = ctz32(bas);
        len = cto32(bas >> basstart);
        wvr += basstart;
    }

    cpu_watchpoint_insert(CPU(cpu), wvr, len, flags,
                          &env->cpu_watchpoint[n]);
}